

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.h
# Opt level: O1

Vec3 cert::trace(Ray *r,World *world,int depth)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  int depth_00;
  float fVar4;
  float fVar5;
  Vec3 VVar6;
  Vec3 VVar7;
  Vec3 VVar8;
  HitRecord rec;
  ScatterOut out;
  float local_c8;
  float fStack_c4;
  HitRecord local_b0;
  char local_7c [4];
  float local_78;
  float local_74;
  float local_70;
  Ray local_6c;
  float local_54;
  Ray local_50;
  undefined1 local_38 [16];
  
  World::hit(&local_b0,world,r,0.001,3.4028235e+38);
  if (local_b0.hit == true) {
    if (depth < 6) {
      VVar7.z = local_b0.p.z;
      VVar7.x = local_b0.p.x;
      VVar7.y = local_b0.p.y;
      VVar8.z = local_b0.normal.z;
      VVar8.x = local_b0.normal.x;
      VVar8.y = local_b0.normal.y;
      VVar7 = World::light_hit(world,VVar7,VVar8);
      (*(local_b0.mat)->_vptr_Material[2])
                (local_b0.p.x,(ulong)(uint)local_b0.p.z,local_b0.normal.x,local_b0.normal.z,
                 local_b0.uv,local_7c,local_b0.mat,r,world);
      if (0.0 <= local_54) {
        depth_00 = depth + 1;
        if (1.0 <= local_54) {
          VVar7 = trace(&local_50,world,depth_00);
          fVar4 = VVar7.z;
          local_78 = VVar7.x;
          fStack_c4 = VVar7.y;
        }
        else {
          VVar7 = trace(&local_6c,world,depth_00);
          VVar8 = trace(&local_50,world,depth_00);
          local_c8 = VVar7.x;
          fStack_c4 = VVar7.y;
          fVar5 = 1.0 - local_54;
          fVar4 = fVar5 * VVar8.z + VVar7.z * local_54;
          local_78 = VVar8.x * fVar5 + local_c8 * local_54;
          fStack_c4 = VVar8.y * fVar5 + fStack_c4 * local_54;
        }
      }
      else {
        local_c8 = VVar7.x;
        fStack_c4 = VVar7.y;
        local_78 = local_78 * local_c8;
        fStack_c4 = fStack_c4 * local_74;
        fVar4 = VVar7.z * local_70;
        if (local_7c[0] == '\x01') {
          local_38 = ZEXT416((uint)local_78);
          VVar7 = trace(&local_6c,world,depth + 1);
          local_78 = (float)local_38._0_4_ * VVar7.x;
          fStack_c4 = fStack_c4 * VVar7.y;
          fVar4 = fVar4 * VVar7.z;
        }
      }
    }
    else {
      fVar4 = 0.0;
      local_78 = 0.0;
      fStack_c4 = 0.0;
    }
  }
  else {
    uVar1 = (r->direction).x;
    uVar2 = (r->direction).y;
    fVar5 = (r->direction).z;
    dVar3 = sqrt((double)(ulong)(uint)(fVar5 * fVar5 +
                                      (float)uVar1 * (float)uVar1 + (float)uVar2 * (float)uVar2));
    fVar5 = ((float)uVar2 / SUB84(dVar3,0) + 1.0) * 0.5;
    fVar4 = 1.0 - fVar5;
    local_78 = fVar5 * 0.5 + fVar4;
    fStack_c4 = fVar5 * 0.7 + fVar4;
    fVar4 = fVar4 + fVar5;
  }
  VVar6.y = fStack_c4;
  VVar6.x = local_78;
  VVar6.z = fVar4;
  return VVar6;
}

Assistant:

constexpr Vec3 trace (const Ray& r, World& world, int depth)
{
	HitRecord rec = world.hit (r, 0.001, std::numeric_limits<float>::max ());
	if (rec.hit)
	{
		if (depth > max_bounces) return VEC3_ZERO;

		auto light_contribution = world.light_hit (rec.p, rec.normal);

		ScatterOut out = rec.mat->scatter (rec.p, rec.normal, rec.uv, r, world.random);
		if (out.index >= 0.0f)
		{
			if (out.index >= 1.0f)
			{
				return trace (out.refracted, world, depth + 1);
			}
			else
			{
				Vec3 reflect_contrib = trace (out.scattered, world, depth + 1);
				Vec3 refract_contrib = trace (out.refracted, world, depth + 1);
				return out.index * reflect_contrib + (1.0 - out.index) * refract_contrib;
			}
		}
		else if (out.is_scattered)
		{
			return light_contribution * out.attenuation * trace (out.scattered, world, depth + 1);
		}
		else
		{
			return light_contribution * out.attenuation;
		}
	}
	else
	{
		return background_color (r.direction);
	}
}